

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkCollectDfs_rec(Cba_Ntk_t *p,int iObj,Vec_Int_t *vObjs)

{
  int iVar1;
  int k;
  int iFanin;
  int iFin;
  Vec_Int_t *vObjs_local;
  int iObj_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_ObjCopy(p,iObj);
  if (iVar1 != 0) {
    Cba_ObjSetCopy(p,iObj,0);
    for (k = Cba_ObjFin0(p,iObj); iVar1 = Cba_ObjFin0(p,iObj + 1), k < iVar1; k = k + 1) {
      iVar1 = Cba_FinFon(p,k);
      iVar1 = Cba_FonObj(p,iVar1);
      if (iVar1 != 0) {
        Cba_NtkCollectDfs_rec(p,iVar1,vObjs);
      }
    }
    Vec_IntPush(vObjs,iObj);
  }
  return;
}

Assistant:

void Cba_NtkCollectDfs_rec( Cba_Ntk_t * p, int iObj, Vec_Int_t * vObjs )
{
    int iFin, iFanin, k;
    if ( !Cba_ObjCopy(p, iObj) )
        return;
    Cba_ObjSetCopy( p, iObj, 0 );
    Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
        Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    Vec_IntPush( vObjs, iObj );
}